

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O2

void __thiscall
icu_63::RBBITableBuilder::sortedAdd(RBBITableBuilder *this,UVector **vector,int32_t val)

{
  int32_t iVar1;
  UVector *this_00;
  char cVar2;
  int index;
  int index_00;
  
  this_00 = *vector;
  if (this_00 == (UVector *)0x0) {
    this_00 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)vector);
    if (this_00 == (UVector *)0x0) {
      *vector = (UVector *)0x0;
      return;
    }
    UVector::UVector(this_00,this->fStatus);
    *vector = this_00;
  }
  if (U_ZERO_ERROR < *this->fStatus) {
    return;
  }
  index_00 = this_00->count;
  index = 0;
  if (index_00 < 1) {
    index_00 = 0;
  }
  do {
    if (index_00 == index) {
LAB_0018489d:
      UVector::insertElementAt(this_00,val,index_00,this->fStatus);
      return;
    }
    iVar1 = UVector::elementAti(this_00,index);
    cVar2 = (val < iVar1) * '\x02';
    if (iVar1 == val) {
      cVar2 = '\x01';
    }
    if (cVar2 != '\0') {
      index_00 = index;
      if (cVar2 != '\x02') {
        return;
      }
      goto LAB_0018489d;
    }
    index = index + 1;
  } while( true );
}

Assistant:

void RBBITableBuilder::sortedAdd(UVector **vector, int32_t val) {
    int32_t i;

    if (*vector == NULL) {
        *vector = new UVector(*fStatus);
    }
    if (*vector == NULL || U_FAILURE(*fStatus)) {
        return;
    }
    UVector *vec = *vector;
    int32_t  vSize = vec->size();
    for (i=0; i<vSize; i++) {
        int32_t valAtI = vec->elementAti(i);
        if (valAtI == val) {
            // The value is already in the vector.  Don't add it again.
            return;
        }
        if (valAtI > val) {
            break;
        }
    }
    vec->insertElementAt(val, i, *fStatus);
}